

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::debugging_internal::ParseBaseUnresolvedName(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  ParseState copy;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar2 + 1;
  state->steps = iVar3 + 1;
  if (iVar3 < 0x20000 && iVar2 < 0x100) {
    bVar7 = ParseSourceName(state);
    if (bVar7) {
      bVar8 = true;
      ParseTemplateArgs(state);
      goto LAB_002759b6;
    }
    uVar4 = (state->parse_state).mangled_idx;
    uVar5 = (state->parse_state).out_cur_idx;
    uVar6 = *(undefined8 *)&(state->parse_state).prev_name_idx;
    bVar7 = ParseTwoCharToken(state,"on");
    if (bVar7) {
      bVar7 = ParseOperatorName(state,(int *)0x0);
      if (!bVar7) goto LAB_00275980;
    }
    else {
LAB_00275980:
      pPVar1 = &state->parse_state;
      pPVar1->mangled_idx = uVar4;
      pPVar1->out_cur_idx = uVar5;
      *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
      bVar7 = ParseTwoCharToken(state,"dn");
      if (!bVar7) {
LAB_002759ed:
        pPVar1->mangled_idx = uVar4;
        pPVar1->out_cur_idx = uVar5;
        *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
        goto LAB_0027593a;
      }
      bVar7 = ParseTemplateParam(state);
      if (!bVar7) {
        bVar7 = ParseDecltype(state);
        bVar8 = true;
        if (bVar7) goto LAB_002759b6;
        bVar7 = ParseSubstitution(state,false);
        if (bVar7) goto LAB_002759b6;
        bVar7 = ParseSourceName(state);
        if (!bVar7) goto LAB_002759ed;
      }
    }
    bVar8 = true;
    ParseTemplateArgs(state);
  }
  else {
LAB_0027593a:
    bVar8 = false;
  }
LAB_002759b6:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar8;
}

Assistant:

static bool ParseBaseUnresolvedName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;

  if (ParseSimpleId(state)) {
    return true;
  }

  ParseState copy = state->parse_state;
  if (ParseTwoCharToken(state, "on") && ParseOperatorName(state, nullptr) &&
      Optional(ParseTemplateArgs(state))) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "dn") &&
      (ParseUnresolvedType(state) || ParseSimpleId(state))) {
    return true;
  }
  state->parse_state = copy;

  return false;
}